

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

int __thiscall
String::clone(String *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  unique_ptr<String,_std::default_delete<String>_> *in_stack_ffffffffffffffe8;
  
  std::make_unique<String,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::unique_ptr<Value,std::default_delete<Value>>::
  unique_ptr<String,std::default_delete<String>,void>
            ((unique_ptr<Value,_std::default_delete<Value>_> *)__fn,in_stack_ffffffffffffffe8);
  std::unique_ptr<String,_std::default_delete<String>_>::~unique_ptr
            ((unique_ptr<String,_std::default_delete<String>_> *)this);
  return (int)this;
}

Assistant:

std::unique_ptr<Value> String::clone() const
{
  return std::make_unique<String>(value_);
}